

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O2

void __thiscall hdc::SourceFile::SourceFile(SourceFile *this)

{
  ASTNode::ASTNode(&this->super_ASTNode);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_0019ae78;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  memset(&this->classes,0,0x98);
  ASTNode::setKind(&this->super_ASTNode,AST_SOURCE);
  return;
}

Assistant:

SourceFile::SourceFile() {
    this->symbolTable = nullptr;
    setKind(AST_SOURCE);
}